

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O2

void __thiscall Junction::Junction(Junction *this,string *name_)

{
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name_);
  Node::Node(&this->super_Node,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Node).super_Element._vptr_Element = (_func_int **)&PTR__Junction_00153c30;
  Demand::Demand(&this->primaryDemand);
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->demands;
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->demands;
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node._M_size = 0;
  this->pMin = -999999999.9;
  this->pFull = -999999999.9;
  this->emitter = (Emitter *)0x0;
  return;
}

Assistant:

Junction::Junction(string name_):
    Node(name_),
    pMin(MISSING),
    pFull(MISSING),
    emitter(nullptr)
{
}